

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifgfu(bifcxdef *ctx,int argc)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  uint uVar5;
  int iVar6;
  long in_RDI;
  voccxdef *vcx;
  prpnum prop;
  int slots;
  runcxdef *rcx;
  runsdef val;
  objnum func;
  vocddef *daem;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  runcxdef *in_stack_ffffffffffffffa0;
  runsdef *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  int local_3c;
  char local_30;
  errcxdef *local_28;
  ushort local_1a;
  runsdef *local_18;
  
  puVar1 = *(undefined8 **)(in_RDI + 8);
  lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x70);
  if (*(char *)(puVar1[4] + -0x10) == '\n') {
    lVar3 = puVar1[4];
    puVar1[4] = lVar3 + -0x10;
    if (*(char *)(lVar3 + -0x10) != '\n') {
      *(undefined4 *)(*(long *)*puVar1 + 0x68) = 0;
      runsign(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    }
    local_1a = *(ushort *)(puVar1[4] + 8);
    in_stack_ffffffffffffffb4 = (uint)local_1a;
    lVar3 = puVar1[4];
    puVar1[4] = lVar3 + -0x10;
    uVar4 = *(undefined8 *)(lVar3 + -0x10);
    local_28 = *(errcxdef **)(lVar3 + -8);
    local_18 = *(runsdef **)(lVar2 + 0xf08);
    for (local_3c = *(int *)(lVar2 + 0xf10); local_3c != 0; local_3c = local_3c + -1) {
      if ((*(ushort *)local_18 == local_1a) &&
         (local_30 = (char)uVar4, *(char *)&local_18->runsv == local_30)) {
        in_stack_ffffffffffffffa0 = (runcxdef *)&stack0xffffffffffffffd8;
        in_stack_ffffffffffffffa8 = local_18 + 1;
        uVar5 = datsiz((dattyp)in_stack_ffffffffffffffa0,
                       (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        iVar6 = memcmp(in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,(ulong)uVar5);
        if (iVar6 == 0) {
LAB_0026b713:
          runpnum((runcxdef *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  (long)in_stack_ffffffffffffffa8);
          return;
        }
      }
      local_18 = local_18 + 2;
    }
  }
  else {
    lVar3 = puVar1[4];
    puVar1[4] = lVar3 + -0x10;
    if (*(char *)(lVar3 + -0x10) != '\x02') {
      *(undefined4 *)(*(long *)*puVar1 + 0x68) = 0;
      runsign(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    }
    local_1a = *(ushort *)(puVar1[4] + 8);
    lVar3 = puVar1[4];
    puVar1[4] = lVar3 + -0x10;
    if (*(char *)(lVar3 + -0x10) != '\r') {
      *(undefined4 *)(*(long *)*puVar1 + 0x68) = 0;
      runsign(in_stack_ffffffffffffffa0,(uint)local_1a);
    }
    local_18 = *(runsdef **)(lVar2 + 0xf18);
    for (local_3c = *(int *)(lVar2 + 0xf20); local_3c != 0; local_3c = local_3c + -1) {
      if ((*(ushort *)local_18 == local_1a) &&
         (local_18[1].runsv.runsvobj == *(objnum *)(puVar1[4] + 8))) goto LAB_0026b713;
      local_18 = local_18 + 2;
    }
  }
  runpush((runcxdef *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
          (dattyp)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(runsdef *)in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void bifgfu(bifcxdef *ctx, int argc)
{
    vocddef  *daem;
    objnum    func;
    runsdef   val;
    runcxdef *rcx = ctx->bifcxrun;
    int       slots;
    prpnum    prop;
    voccxdef *vcx = ctx->bifcxrun->runcxvoc;

    bifcntargs(ctx, 2, argc);
 
    if (runtostyp(rcx) == DAT_FNADDR)
    {
        /* check on a setfuse()-style fuse: get fnaddr, parm */
        func = runpopfn(rcx);
        runpop(rcx, &val);

        for (slots = vcx->voccxfuc, daem = vcx->voccxfus ;
             slots ; ++daem, --slots)
        {
            if (daem->vocdfn == func
                && daem->vocdarg.runstyp == val.runstyp
                && !memcmp(&val.runsv, &daem->vocdarg.runsv,
                           (size_t)datsiz(val.runstyp, &val.runsv)))
                goto ret_num;
        }
    }
    else
    {
        /* check on a notify()-style fuse: get object, &message */
        func = runpopobj(rcx);
        prop = runpopprp(rcx);

        for (slots = vcx->voccxalc, daem = vcx->voccxalm ;
             slots ; ++daem, --slots)
        {
            if (daem->vocdfn == func && daem->vocdprp == prop)
                goto ret_num;
        }
    }
    
    /* didn't find anything - return nil */
    runpush(rcx, DAT_NIL, &val);
    return;
    
ret_num:
    /* return current daem->vocdtim */
    runpnum(rcx, (long)daem->vocdtim);
    return;
}